

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

RABlock * __thiscall
asmjit::BaseRAPass::_nearestCommonDominator(BaseRAPass *this,RABlock *a,RABlock *b)

{
  bool bVar1;
  RABlock *pRVar2;
  uint64_t uVar3;
  RABlock *pRVar4;
  uint64_t *puVar5;
  
  if (a == (RABlock *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
               ,0x21f,"a != nullptr");
  }
  if (b != (RABlock *)0x0) {
    if (a == b) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
                 ,0x221,"a != b");
    }
    bVar1 = _strictlyDominates(this,a,b);
    pRVar4 = a;
    if ((!bVar1) && (bVar1 = _strictlyDominates(this,b,a), pRVar4 = b, !bVar1)) {
      pRVar2 = entryBlock(this);
      puVar5 = &this->_lastTimestamp;
      uVar3 = this->_lastTimestamp + 1;
      do {
        *puVar5 = uVar3;
        a = a->_idom;
        puVar5 = &a->_timestamp;
      } while (a != pRVar2);
      do {
        pRVar4 = b->_idom;
        if (pRVar4 == pRVar2) {
          return pRVar2;
        }
        b = pRVar4;
      } while (pRVar4->_timestamp != uVar3);
    }
    return pRVar4;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
             ,0x220,"b != nullptr");
}

Assistant:

const RABlock* BaseRAPass::_nearestCommonDominator(const RABlock* a, const RABlock* b) const noexcept {
  ASMJIT_ASSERT(a != nullptr); // There must be at least one block if this function is
  ASMJIT_ASSERT(b != nullptr); // called, as both `a` and `b` must be valid blocks.
  ASMJIT_ASSERT(a != b);       // Checked by `dominates()` and `properlyDominates()`.

  if (a == b)
    return a;

  // If `a` strictly dominates `b` then `a` is the nearest common dominator.
  if (_strictlyDominates(a, b))
    return a;

  // If `b` strictly dominates `a` then `b` is the nearest common dominator.
  if (_strictlyDominates(b, a))
    return b;

  const RABlock* entryBlock = this->entryBlock();
  uint64_t timestamp = nextTimestamp();

  // Mark all A's dominators.
  const RABlock* block = a->iDom();
  while (block != entryBlock) {
    block->setTimestamp(timestamp);
    block = block->iDom();
  }

  // Check all B's dominators against marked dominators of A.
  block = b->iDom();
  while (block != entryBlock) {
    if (block->hasTimestamp(timestamp))
      return block;
    block = block->iDom();
  }

  return entryBlock;
}